

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O3

wchar_t best_effort_strncat_from_utf16
                  (archive_string *as,void *_p,size_t bytes,archive_string_conv *sc,wchar_t be)

{
  wchar_t wVar1;
  char cVar2;
  wchar_t wVar3;
  archive_string *paVar4;
  char *pcVar5;
  wchar_t wVar6;
  uint32_t uc;
  uint local_3c;
  archive_string *local_38;
  
  paVar4 = archive_string_ensure(as,bytes + as->length + 1);
  if (paVar4 == (archive_string *)0x0) {
    wVar6 = L'\xffffffff';
  }
  else {
    pcVar5 = as->s + as->length;
    local_38 = as;
    wVar3 = utf16_to_unicode(&local_3c,(char *)_p,bytes,(wchar_t)sc);
    wVar6 = L'\0';
    while (wVar3 != L'\0') {
      wVar1 = -wVar3;
      if (L'\0' < wVar3) {
        wVar1 = wVar3;
      }
      if (wVar3 < L'\0') {
        wVar6 = L'\xffffffff';
      }
      bytes = bytes - (uint)wVar1;
      _p = (void *)((long)_p + (ulong)(uint)wVar1);
      cVar2 = (char)local_3c;
      if (0x7f < local_3c) {
        cVar2 = '?';
        wVar6 = L'\xffffffff';
      }
      *pcVar5 = cVar2;
      pcVar5 = pcVar5 + 1;
      wVar3 = utf16_to_unicode(&local_3c,(char *)_p,bytes,(wchar_t)sc);
    }
    local_38->length = (long)pcVar5 - (long)local_38->s;
    *pcVar5 = '\0';
  }
  return wVar6;
}

Assistant:

static int
best_effort_strncat_from_utf16(struct archive_string *as, const void *_p,
    size_t bytes, struct archive_string_conv *sc, int be)
{
	const char *utf16 = (const char *)_p;
	char *mbs;
	uint32_t uc;
	int n, ret;

	(void)sc; /* UNUSED */
	/*
	 * Other case, we should do the best effort.
	 * If all character are ASCII(<0x7f), we can convert it.
	 * if not , we set a alternative character and return -1.
	 */
	ret = 0;
	if (archive_string_ensure(as, as->length + bytes +1) == NULL)
		return (-1);
	mbs = as->s + as->length;

	while ((n = utf16_to_unicode(&uc, utf16, bytes, be)) != 0) {
		if (n < 0) {
			n *= -1;
			ret =  -1;
		}
		bytes -= n;
		utf16 += n;

		if (uc > 127) {
			/* We cannot handle it. */
			*mbs++ = '?';
			ret =  -1;
		} else
			*mbs++ = (char)uc;
	}
	as->length = mbs - as->s;
	as->s[as->length] = '\0';
	return (ret);
}